

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O2

void KokkosTools::PerfettoConnector::kokkosp_begin_parallel_for
               (char *name,uint32_t dev_id,uint64_t *param_3)

{
  uint32_t dev_id_local;
  StaticString local_8;
  
  if (perfetto::internal::g_category_state_storage != 0) {
    dev_id_local = dev_id;
    local_8.value = name;
    perfetto::internal::
    TrackEventDataSource<perfetto::TrackEvent,&perfetto::internal::kCategoryRegistry>::
    TraceForCategory<unsigned_long,perfetto::StaticString,char_const(&)[7],unsigned_int_const&>
              ((uint)perfetto::internal::g_category_state_storage,
               &kokkosp_begin_parallel_for::kCatIndex_ADD_TO_PERFETTO_DEFINE_CATEGORIES_IF_FAILS_173
               ,&local_8,TrackEvent_Type_TYPE_SLICE_BEGIN,(char (*) [7])0x378bed,&dev_id_local);
  }
  return;
}

Assistant:

void kokkosp_begin_parallel_for(const char *name, const uint32_t dev_id,
                                uint64_t *) {
  TRACE_EVENT_BEGIN("kokkos.parallel_for", perfetto::StaticString{name},
                    "device", dev_id);
}